

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O1

void CPU::WDC65816::ProcessorStorageConstructor::absolute_indirect_jmp
               (AccessType param_1,bool param_2,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  MicroOp local_e [6];
  
  local_e[0] = CycleFetchIncrementPC;
  if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*target->_M_invoker)((_Any_data *)target,local_e);
    local_e[1] = 1;
    if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*target->_M_invoker)((_Any_data *)target,local_e + 1);
      local_e[2] = 0x1b;
      if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
        (*target->_M_invoker)((_Any_data *)target,local_e + 2);
        local_e[3] = 7;
        if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
          (*target->_M_invoker)((_Any_data *)target,local_e + 3);
          local_e[4] = 6;
          if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
            (*target->_M_invoker)((_Any_data *)target,local_e + 4);
            local_e[5] = 0x2e;
            if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
              (*target->_M_invoker)((_Any_data *)target,local_e + 5);
              return;
            }
          }
        }
      }
    }
  }
  std::__throw_bad_function_call();
}

Assistant:

static void absolute_indirect_jmp(AccessType, bool, const std::function<void(MicroOp)> &target) {
		target(CycleFetchIncrementPC);			// New AAL.
		target(CycleFetchPC);					// New AAH.

		target(OperationConstructAbsolute16);	// Calculate data address.
		target(CycleFetchIncrementData);		// New PCL.
		target(CycleFetchData);					// New PCH.

		target(OperationPerform);				// [JMP]
	}